

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_ASTVisitor.h
# Opt level: O0

ModuleBase * __thiscall
soul::RewritingASTVisitor::visitObject(RewritingASTVisitor *this,ModuleBase *t)

{
  ObjectType OVar1;
  int iVar2;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  allocator<char> local_41;
  string local_40;
  ModuleBase *local_20;
  ModuleBase *t_local;
  RewritingASTVisitor *this_local;
  
  OVar1 = (t->super_ASTObject).objectType;
  local_20 = t;
  t_local = (ModuleBase *)this;
  if (OVar1 == Graph) {
    iVar2 = (*this->_vptr_RewritingASTVisitor[4])(this,t);
    this_local = (RewritingASTVisitor *)CONCAT44(extraout_var,iVar2);
  }
  else if (OVar1 == Processor) {
    iVar2 = (*this->_vptr_RewritingASTVisitor[3])(this,t);
    this_local = (RewritingASTVisitor *)CONCAT44(extraout_var_00,iVar2);
  }
  else {
    if (OVar1 != Namespace) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_40,"Unknown AST module",&local_41);
      throwInternalCompilerError(&local_40);
    }
    iVar2 = (*this->_vptr_RewritingASTVisitor[5])(this,t);
    this_local = (RewritingASTVisitor *)CONCAT44(extraout_var_01,iVar2);
  }
  return (ModuleBase *)this_local;
}

Assistant:

AST::ModuleBase& visitObject (AST::ModuleBase& t)
    {
        switch (t.objectType)
        {
            SOUL_AST_MODULES (SOUL_INVOKE_FOR_SUBCLASS)
            default: throwInternalCompilerError ("Unknown AST module"); return t;
        }
    }